

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

void __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::splitFallback(BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  BBox1f BVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  PrimRefVector pmVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  BBox1f *pBVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  uint uVar34;
  uint uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pmVar6 = set->prims;
  uVar7 = (set->super_PrimInfoMB).object_range._begin;
  uVar8 = (set->super_PrimInfoMB).object_range._end;
  uVar11 = uVar7 + uVar8 + 1 >> 1;
  fVar19 = 0.0;
  fVar21 = 1.0;
  fVar26 = 0.0;
  local_b0 = 1.0;
  local_98._8_8_ = 0x7f8000007f800000;
  local_98._0_8_ = 0x7f8000007f800000;
  local_a8._8_8_ = 0xff800000ff800000;
  local_a8._0_8_ = 0xff800000ff800000;
  lVar9 = uVar11 - uVar7;
  auVar22 = _DAT_01f7a9f0;
  auVar25 = _DAT_01f7a9f0;
  auVar27 = _DAT_01f7aa00;
  auVar28 = _DAT_01f7aa00;
  auVar36 = _DAT_01f7aa00;
  auVar38 = _DAT_01f7a9f0;
  if (uVar11 < uVar7 || lVar9 == 0) {
    uVar14 = 0;
    sVar12 = 0;
    fVar24 = 1.0;
    fVar30 = 0.0;
    fVar18 = 0.0;
    fVar20 = 1.0;
  }
  else {
    pBVar16 = &pmVar6->items[uVar7].time_range;
    fVar18 = 0.0;
    fVar20 = 1.0;
    fVar24 = 1.0;
    sVar12 = 0;
    uVar15 = 0;
    fVar17 = 0.0;
    do {
      auVar23 = *(undefined1 (*) [16])&pBVar16[-8].lower;
      auVar37 = *(undefined1 (*) [16])(pBVar16 + -6);
      auVar39 = *(undefined1 (*) [16])(pBVar16 + -4);
      auVar2 = *(undefined1 (*) [16])(pBVar16 + -2);
      auVar38 = minps(auVar38,auVar39);
      auVar25 = minps(auVar25,auVar23);
      auVar27 = maxps(auVar27,auVar2);
      auVar28 = maxps(auVar28,auVar37);
      fVar30 = auVar37._0_4_ * 0.5 + auVar2._0_4_ * 0.5 + auVar23._0_4_ * 0.5 + auVar39._0_4_ * 0.5;
      fVar31 = auVar37._4_4_ * 0.5 + auVar2._4_4_ * 0.5 + auVar23._4_4_ * 0.5 + auVar39._4_4_ * 0.5;
      fVar32 = auVar37._8_4_ * 0.5 + auVar2._8_4_ * 0.5 + auVar23._8_4_ * 0.5 + auVar39._8_4_ * 0.5;
      fVar33 = auVar37._12_4_ * 0.5 + auVar2._12_4_ * 0.5 +
               auVar23._12_4_ * 0.5 + auVar39._12_4_ * 0.5;
      auVar23._4_4_ = fVar31;
      auVar23._0_4_ = fVar30;
      auVar23._8_4_ = fVar32;
      auVar23._12_4_ = fVar33;
      auVar22 = minps(auVar22,auVar23);
      auVar37._4_4_ = fVar31;
      auVar37._0_4_ = fVar30;
      auVar37._8_4_ = fVar32;
      auVar37._12_4_ = fVar33;
      auVar36 = maxps(auVar36,auVar37);
      fVar31 = (*pBVar16).lower;
      if (fVar31 <= fVar24) {
        fVar24 = fVar31;
      }
      fVar32 = (*pBVar16).upper;
      fVar30 = fVar32;
      if (fVar32 <= fVar17) {
        fVar30 = fVar17;
      }
      sVar12 = sVar12 + (uint)pBVar16[-3].upper;
      uVar13 = (ulong)(uint)pBVar16[-1].upper;
      uVar14 = uVar13;
      if (uVar13 < uVar15) {
        uVar14 = uVar15;
      }
      uVar34 = (int)((uint)(uVar15 < uVar13) << 0x1f) >> 0x1f;
      uVar35 = (int)((uint)(uVar15 < uVar13) << 0x1f) >> 0x1f;
      fVar18 = (float)(~uVar34 & (uint)fVar18 | (uint)fVar31 & uVar34);
      fVar20 = (float)(~uVar35 & (uint)fVar20 | (uint)fVar32 & uVar35);
      pBVar16 = pBVar16 + 10;
      lVar9 = lVar9 + -1;
      uVar15 = uVar14;
      fVar17 = fVar30;
    } while (lVar9 != 0);
  }
  lVar9 = uVar8 - uVar11;
  local_88 = auVar38._0_8_;
  uStack_80 = auVar38._8_8_;
  auVar38 = _DAT_01f7a9f0;
  auVar23 = _DAT_01f7aa00;
  auVar37 = _DAT_01f7aa00;
  auVar39 = _DAT_01f7a9f0;
  if (uVar8 < uVar11 || lVar9 == 0) {
    uVar15 = 0;
    sVar10 = 0;
  }
  else {
    pBVar16 = &pmVar6->items[uVar11].time_range;
    fVar19 = 0.0;
    fVar21 = 1.0;
    local_b0 = 1.0;
    sVar10 = 0;
    local_98 = _DAT_01f7a9f0;
    local_a8 = _DAT_01f7aa00;
    uVar13 = 0;
    fVar17 = 0.0;
    do {
      auVar2 = *(undefined1 (*) [16])&pBVar16[-8].lower;
      auVar3 = *(undefined1 (*) [16])(pBVar16 + -6);
      auVar4 = *(undefined1 (*) [16])(pBVar16 + -4);
      auVar5 = *(undefined1 (*) [16])(pBVar16 + -2);
      auVar38 = minps(auVar38,auVar4);
      auVar39 = minps(auVar39,auVar2);
      auVar23 = maxps(auVar23,auVar5);
      auVar37 = maxps(auVar37,auVar3);
      auVar29._0_4_ =
           auVar3._0_4_ * 0.5 + auVar5._0_4_ * 0.5 + auVar2._0_4_ * 0.5 + auVar4._0_4_ * 0.5;
      auVar29._4_4_ =
           auVar3._4_4_ * 0.5 + auVar5._4_4_ * 0.5 + auVar2._4_4_ * 0.5 + auVar4._4_4_ * 0.5;
      auVar29._8_4_ =
           auVar3._8_4_ * 0.5 + auVar5._8_4_ * 0.5 + auVar2._8_4_ * 0.5 + auVar4._8_4_ * 0.5;
      auVar29._12_4_ =
           auVar3._12_4_ * 0.5 + auVar5._12_4_ * 0.5 + auVar2._12_4_ * 0.5 + auVar4._12_4_ * 0.5;
      local_98 = minps(local_98,auVar29);
      local_a8 = maxps(local_a8,auVar29);
      fVar31 = (*pBVar16).lower;
      if (fVar31 <= local_b0) {
        local_b0 = fVar31;
      }
      fVar32 = (*pBVar16).upper;
      fVar26 = fVar32;
      if (fVar32 <= fVar17) {
        fVar26 = fVar17;
      }
      sVar10 = sVar10 + (uint)pBVar16[-3].upper;
      uVar15 = (ulong)(uint)pBVar16[-1].upper;
      uVar34 = (int)((uint)(uVar13 < uVar15) << 0x1f) >> 0x1f;
      uVar35 = (int)((uint)(uVar13 < uVar15) << 0x1f) >> 0x1f;
      fVar19 = (float)(~uVar34 & (uint)fVar19 | (uint)fVar31 & uVar34);
      fVar21 = (float)(~uVar35 & (uint)fVar21 | (uint)fVar32 & uVar35);
      if (uVar15 < uVar13) {
        uVar15 = uVar13;
      }
      pBVar16 = pBVar16 + 10;
      lVar9 = lVar9 + -1;
      uVar13 = uVar15;
      fVar17 = fVar26;
    } while (lVar9 != 0);
  }
  BVar1 = (set->super_PrimInfoMB).time_range;
  local_58 = auVar25._0_8_;
  uStack_50 = auVar25._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower
    .field_0 = local_58;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.lower.field_0 + 8) = uStack_50;
  local_48 = auVar28._0_8_;
  uStack_40 = auVar28._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper
    .field_0 = local_48;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0 + 8) = uStack_40;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower
    .field_0 = local_88;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0 + 8) = uStack_80;
  *(undefined1 (*) [16])
   (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
   field_0.m128 = auVar27;
  local_78 = auVar22._0_8_;
  uStack_70 = auVar22._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0
       = local_78;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
           field_0 + 8) = uStack_70;
  local_68 = auVar36._0_8_;
  uStack_60 = auVar36._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0
       = local_68;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
           field_0 + 8) = uStack_60;
  (lset->super_PrimInfoMB).num_time_segments = sVar12;
  (lset->super_PrimInfoMB).max_num_time_segments = uVar14;
  (lset->super_PrimInfoMB).max_time_range.lower = fVar18;
  (lset->super_PrimInfoMB).max_time_range.upper = fVar20;
  fVar18 = BVar1.lower;
  fVar20 = BVar1.upper;
  if (fVar18 <= fVar24) {
    fVar18 = fVar24;
  }
  if (fVar20 <= fVar30) {
    fVar30 = fVar20;
  }
  lset->prims = pmVar6;
  (lset->super_PrimInfoMB).object_range._begin = uVar7;
  (lset->super_PrimInfoMB).object_range._end = uVar11;
  (lset->super_PrimInfoMB).time_range.lower = fVar18;
  (lset->super_PrimInfoMB).time_range.upper = fVar30;
  pmVar6 = set->prims;
  BVar1 = (set->super_PrimInfoMB).time_range;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
   field_0.m128 = auVar39;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
   field_0.m128 = auVar37;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
   field_0.m128 = auVar38;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
   field_0.m128 = auVar23;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0
       = local_98._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
           field_0 + 8) = local_98._8_8_;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0
       = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
           field_0 + 8) = local_a8._8_8_;
  (rset->super_PrimInfoMB).num_time_segments = sVar10;
  (rset->super_PrimInfoMB).max_num_time_segments = uVar15;
  (rset->super_PrimInfoMB).max_time_range.lower = fVar19;
  (rset->super_PrimInfoMB).max_time_range.upper = fVar21;
  fVar19 = BVar1.lower;
  fVar21 = BVar1.upper;
  if (fVar19 <= local_b0) {
    fVar19 = local_b0;
  }
  if (fVar21 <= fVar26) {
    fVar26 = fVar21;
  }
  rset->prims = pmVar6;
  (rset->super_PrimInfoMB).object_range._begin = uVar11;
  (rset->super_PrimInfoMB).object_range._end = uVar8;
  (rset->super_PrimInfoMB).time_range.lower = fVar19;
  (rset->super_PrimInfoMB).time_range.upper = fVar26;
  return;
}

Assistant:

void splitFallback(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            mvector<PrimRefMB>& prims = *set.prims;

            const size_t begin = set.begin();
            const size_t end   = set.end();
            const size_t center = (begin + end + 1) / 2;

            PrimInfoMB linfo = empty;
            for (size_t i=begin; i<center; i++)
              linfo.add_primref(prims[i]);

            PrimInfoMB rinfo = empty;
            for (size_t i=center; i<end; i++)
              rinfo.add_primref(prims[i]);

            new (&lset) SetMB(linfo,set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(rinfo,set.prims,range<size_t>(center,end  ),set.time_range);
          }